

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::SingleFileErrorCollector::RecordError
          (SingleFileErrorCollector *this,int line,int column,string_view message)

{
  MultiFileErrorCollector *pMVar1;
  undefined1 auVar2 [16];
  int column_local;
  int line_local;
  SingleFileErrorCollector *this_local;
  string_view message_local;
  
  if (this->multi_file_error_collector_ != (MultiFileErrorCollector *)0x0) {
    pMVar1 = this->multi_file_error_collector_;
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->filename_);
    (*pMVar1->_vptr_MultiFileErrorCollector[2])
              (pMVar1,auVar2._0_8_,auVar2._8_8_,(ulong)(uint)line,(ulong)(uint)column,message._M_str
               ,message._M_len,message._M_str);
  }
  this->had_errors_ = true;
  return;
}

Assistant:

void RecordError(int line, int column, absl::string_view message) override {
    if (multi_file_error_collector_ != nullptr) {
      multi_file_error_collector_->RecordError(filename_, line, column,
                                               message);
    }
    had_errors_ = true;
  }